

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_makers.hpp
# Opt level: O2

bool so_5::details::handlers_bunch_basics_t::find_and_use_handler
               (msg_type_and_handler_pair_t *left,msg_type_and_handler_pair_t *right,
               type_index *msg_type,message_ref_t *message,invocation_type_t invocation)

{
  anon_class_24_3_ebd80789 handler;
  bool bVar1;
  msg_type_and_handler_pair_t *this;
  msg_type_and_handler_pair_t *it;
  msg_type_and_handler_pair_t key;
  msg_type_and_handler_pair_t *local_80;
  msg_type_and_handler_pair_t **local_78;
  message_ref_t *pmStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  type_index local_60;
  _Any_data local_58;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_60 = (type_index)msg_type->_M_target;
  local_38 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  this = std::
         __lower_bound<so_5::details::msg_type_and_handler_pair_t_const*,so_5::details::msg_type_and_handler_pair_t,__gnu_cxx::__ops::_Iter_less_val>
                   (left,right,&local_60);
  local_80 = this;
  if (this != right) {
    bVar1 = std::type_index::operator==(&this->m_msg_type,&local_60);
    if (bVar1) {
      bVar1 = true;
      if (invocation == service_request) {
        local_78 = &local_80;
        local_68 = 1;
        handler._20_4_ = uStack_64;
        handler.invocation = 1;
        handler.message = message;
        handler.it = local_78;
        pmStack_70 = message;
        msg_service_request_base_t::
        dispatch_wrapper<so_5::details::handlers_bunch_basics_t::find_and_use_handler(so_5::details::msg_type_and_handler_pair_t_const*,so_5::details::msg_type_and_handler_pair_t_const*,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>&,so_5::invocation_type_t)::_lambda()_1_>
                  (message,handler);
      }
      else if (invocation == event) {
        std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::
        operator()(&this->m_handler,event,message);
      }
      goto LAB_0025c3e7;
    }
  }
  bVar1 = false;
LAB_0025c3e7:
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return bVar1;
}

Assistant:

static inline bool
		find_and_use_handler(
			const msg_type_and_handler_pair_t * left,
			const msg_type_and_handler_pair_t * right,
			const std::type_index & msg_type,
			message_ref_t & message,
			invocation_type_t invocation )
			{
				bool ret_value = false;

				msg_type_and_handler_pair_t key{ msg_type };
				auto it = std::lower_bound( left, right, key );
				if( it != right && it->m_msg_type == key.m_msg_type )
					{
						// Handler is found and must be called.
						ret_value = true;
						if( invocation_type_t::event == invocation )
							// This is a async message.
							// Simple call is enough.
							it->m_handler( invocation, message );
						else if( invocation_type_t::service_request == invocation )
							// Invocation should be done in a special wrapper.
							msg_service_request_base_t::dispatch_wrapper(
									message,
									[&it, &message, invocation] {
										it->m_handler( invocation, message );
									} );
					}

				return ret_value;
			}